

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_compileoption_used(char *zOptName)

{
  int iVar1;
  int iVar2;
  char **ppcVar3;
  char *in_RDI;
  long in_FS_OFFSET;
  char **azCompileOpt;
  int n;
  int i;
  int nOpt;
  char *in_stack_ffffffffffffffc8;
  int local_1c;
  char *local_18;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = -0x55555556;
  ppcVar3 = sqlite3CompileOptions(&local_c);
  iVar1 = sqlite3_strnicmp(in_RDI,"SQLITE_",7);
  local_18 = in_RDI;
  if (iVar1 == 0) {
    local_18 = in_RDI + 7;
  }
  iVar1 = sqlite3Strlen30(in_stack_ffffffffffffffc8);
  local_1c = 0;
  do {
    if (local_c <= local_1c) {
      local_10 = 0;
LAB_00151bfd:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_10;
      }
      __stack_chk_fail();
    }
    iVar2 = sqlite3_strnicmp(local_18,ppcVar3[local_1c],iVar1);
    if (iVar2 == 0) {
      iVar2 = sqlite3IsIdChar(ppcVar3[local_1c][iVar1]);
      if (iVar2 == 0) {
        local_10 = 1;
        goto LAB_00151bfd;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

SQLITE_API int sqlite3_compileoption_used(const char *zOptName){
  int i, n;
  int nOpt;
  const char **azCompileOpt;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( zOptName==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif

  azCompileOpt = sqlite3CompileOptions(&nOpt);

  if( sqlite3StrNICmp(zOptName, "SQLITE_", 7)==0 ) zOptName += 7;
  n = sqlite3Strlen30(zOptName);

  /* Since nOpt is normally in single digits, a linear search is
  ** adequate. No need for a binary search. */
  for(i=0; i<nOpt; i++){
    if( sqlite3StrNICmp(zOptName, azCompileOpt[i], n)==0
     && sqlite3IsIdChar((unsigned char)azCompileOpt[i][n])==0
    ){
      return 1;
    }
  }
  return 0;
}